

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::OutputCountCase::genVertexAttribData
          (OutputCountCase *this)

{
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *this_00;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *this_01;
  int iVar1;
  pointer pVVar2;
  long lVar3;
  int ndx;
  ulong uVar4;
  float fVar5;
  undefined4 uVar6;
  
  this_00 = &(this->super_GeometryShaderRenderTest).m_vertexPosData;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (this_00,(long)this->m_primitiveCount);
  this_01 = &(this->super_GeometryShaderRenderTest).m_vertexAttrData;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (this_01,(long)this->m_primitiveCount);
  lVar3 = 8;
  for (uVar4 = 0; iVar1 = this->m_primitiveCount, (long)uVar4 < (long)iVar1; uVar4 = uVar4 + 1) {
    fVar5 = (float)(int)uVar4 / (float)iVar1;
    pVVar2 = (this_00->
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)((long)pVVar2->m_data + lVar3 + -8) = 0xbf800000;
    *(float *)((long)pVVar2->m_data + lVar3 + -4) = fVar5 + fVar5 + -1.0;
    *(undefined8 *)((long)pVVar2->m_data + lVar3) = 0x3f80000000000000;
    uVar6 = 0x3f800000;
    if ((uVar4 & 1) != 0) {
      uVar6 = 0;
    }
    pVVar2 = (this_01->
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)((long)pVVar2->m_data + lVar3 + -8) = 0x3f800000;
    *(undefined4 *)((long)pVVar2->m_data + lVar3 + -4) = uVar6;
    *(undefined4 *)((long)pVVar2->m_data + lVar3) = uVar6;
    *(undefined4 *)((long)pVVar2->m_data + lVar3 + 4) = 0x3f800000;
    lVar3 = lVar3 + 0x10;
  }
  (this->super_GeometryShaderRenderTest).m_numDrawVertices = iVar1;
  return;
}

Assistant:

void OutputCountCase::genVertexAttribData (void)
{
	m_vertexPosData.resize(m_primitiveCount);
	m_vertexAttrData.resize(m_primitiveCount);

	for (int ndx = 0; ndx < m_primitiveCount; ++ndx)
	{
		m_vertexPosData[ndx] = tcu::Vec4(-1.0f, ((float)ndx) / (float)m_primitiveCount * 2.0f - 1.0f, 0.0f, 1.0f);
		m_vertexAttrData[ndx] = (ndx % 2 == 0) ? tcu::Vec4(1, 1, 1, 1) : tcu::Vec4(1, 0, 0, 1);
	}

	m_numDrawVertices = m_primitiveCount;
}